

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O3

_Bool build_nest(chunk *c,loc_conflict centre,wchar_t rating)

{
  bool bVar1;
  monster_group_info group_info;
  _Bool _Var2;
  uint32_t uVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  monster_race *pmVar6;
  wchar_t wVar7;
  bool bVar8;
  wchar_t x1;
  wchar_t wVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  loc grid;
  monster_group_info info;
  monster_race *what [64];
  wchar_t local_280;
  loc_conflict local_260;
  wchar_t local_254;
  ulong local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 auStack_238 [65];
  int iVar9;
  
  local_260 = centre;
  uVar3 = Rand_div(4);
  local_248 = 0;
  uStack_240 = 0;
  wVar7 = uVar3 * 2 + L'\r';
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,L'\v',wVar7);
  local_280 = centre.y;
  if ((c->height <= local_280) || (c->width <= centre.x)) {
    _Var2 = find_space(&local_260,L'\v',wVar7);
    if (!_Var2) {
      return false;
    }
    centre = (loc_conflict)((ulong)local_260 & 0xffffffff);
    local_280 = local_260.y;
  }
  iVar11 = (int)(uVar3 * 2 + 0xb) / 2;
  iVar9 = centre.x;
  x1 = iVar9 - iVar11;
  local_254 = iVar9 + iVar11 + L'\x01';
  lVar13 = 0;
  local_250 = (ulong)uVar3;
  generate_room(c,local_280 + L'\xfffffffb',x1 + L'\xffffffff',local_280 + L'\x05',local_254,L'\0');
  draw_rectangle(c,local_280 + L'\xfffffffb',x1 + L'\xffffffff',local_280 + L'\x05',local_254,
                 FEAT_GRANITE,L'\f',false);
  fill_rectangle(c,local_280 + L'\xfffffffc',x1,local_280 + L'\x04',iVar9 + iVar11,FEAT_FLOOR,L'\0')
  ;
  wVar7 = iVar9 + iVar11 + L'\xffffffff';
  draw_rectangle(c,local_280 + L'\xfffffffd',x1 + L'\x01',local_280 + L'\x03',wVar7,FEAT_GRANITE,
                 L'\v',false);
  generate_hole(c,local_280 + L'\xfffffffd',x1 + L'\x01',local_280 + L'\x03',wVar7,FEAT_CLOSED);
  set_pit_type(c->depth,L'\x02');
  event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,dun->pit_type->name);
  wVar7 = dun->pit_type->obj_rarity;
  get_mon_num_prep(mon_pit_hook);
  bVar1 = false;
  do {
    bVar8 = bVar1;
    pmVar6 = get_mon_num(c->depth + L'\n',c->depth);
    auStack_238[lVar13] = pmVar6;
    lVar13 = lVar13 + 1;
    bVar1 = (bool)(bVar8 | pmVar6 == (monster_race *)0x0);
  } while (lVar13 != 0x40);
  _Var2 = false;
  get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
  if (!bVar8 && pmVar6 != (monster_race *)0x0) {
    if ((player->opts).opt[0x18] == true) {
      msg("Monster nest (%s)",dun->pit_type->name);
    }
    add_to_monster_rating(c,dun->pit_type->ave / 0x14 + (int)local_250);
    wVar4 = local_280 + L'\xfffffffe';
    do {
      iVar12 = iVar11 * 2 + -3;
      wVar10 = x1 + L'\x02';
      if (x1 + L'\x02' <= iVar9 + iVar11 + L'\xfffffffe') {
        do {
          uVar3 = Rand_div(0x40);
          grid.y = wVar4;
          grid.x = wVar10;
          group_info.player_race._0_4_ = (int)uStack_240;
          group_info.index = (undefined4)local_248;
          group_info.role = local_248._4_4_;
          group_info.player_race._4_4_ = (int)((ulong)uStack_240 >> 0x20);
          place_new_monster(c,grid,(monster_race *)auStack_238[(int)uVar3],false,false,group_info,
                            '\f');
          wVar5 = Rand_div(100);
          if (wVar5 < wVar7) {
            wVar5 = c->depth;
            uVar3 = Rand_div(3);
            place_object((chunk_conflict *)c,(loc_conflict)grid,wVar5 + L'\n',uVar3 == 0,false,
                         '\x04',L'\0');
          }
          iVar12 = iVar12 + -1;
          wVar10 = wVar10 + L'\x01';
        } while (iVar12 != 0);
      }
      bVar1 = wVar4 < local_280 + L'\x02';
      wVar4 = wVar4 + L'\x01';
    } while (bVar1);
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool build_nest(struct chunk *c, struct loc centre, int rating)
{
	struct loc grid;
	int y1, x1, y2, x2;
	int i;
	int alloc_obj;
	struct monster_race *what[64];
	bool empty = false;
	int light = false;
	int size_vary = randint0(4);
	int height = 9;
	int width = 11 + 2 * size_vary;
	struct monster_group_info info = { 0, 0, 0 };

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Large room */
	y1 = centre.y - height / 2;
	y2 = centre.y + height / 2;
	x1 = centre.x - width / 2;
	x2 = centre.x + width / 2;

	/* Generate new room */
	generate_room(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, light);

	/* Generate outer walls */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);

	/* Generate inner floors */
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	/* Advance to the center room */
	y1 = y1 + 2;
	y2 = y2 - 2;
	x1 = x1 + 2;
	x2 = x2 - 2;

	/* Generate inner walls; add one door as entrance */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_INNER, false);
	generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

	/* Decide on the pit type */
	set_pit_type(c->depth, 2);
	event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, dun->pit_type->name);

	/* Chance of objects on the floor */
	alloc_obj = dun->pit_type->obj_rarity;
	
	/* Prepare allocation table */
	get_mon_num_prep(mon_pit_hook);

	/* Pick some monster types */
	for (i = 0; i < 64; i++) {
		/* Get a (hard) monster type */
		what[i] = get_mon_num(c->depth + 10, c->depth);

		/* Notice failure */
		if (!what[i]) empty = true;
	}

	/* Prepare allocation table */
	get_mon_num_prep(NULL);

	/* Oops */
	if (empty) return false;

	/* Describe */
	ROOM_LOG("Monster nest (%s)", dun->pit_type->name);

	/* Increase the level rating */
	add_to_monster_rating(c, size_vary + dun->pit_type->ave / 20);

	/* Place some monsters */
	for (grid.y = y1; grid.y <= y2; grid.y++) {
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			/* Figure out what monster is being used, and place that monster */
			struct monster_race *race = what[randint0(64)];
			place_new_monster(c, grid, race, false, false, info,
							  ORIGIN_DROP_PIT);

			/* Occasionally place an item, making it good 1/3 of the time */
			if (randint0(100) < alloc_obj) 
				place_object(c, grid, c->depth + 10, one_in_(3), false,
							 ORIGIN_PIT, 0);
		}
	}

	return true;
}